

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidgetitemiterator.cpp
# Opt level: O1

void __thiscall
QTreeWidgetItemIterator::QTreeWidgetItemIterator
          (QTreeWidgetItemIterator *this,QTreeWidgetItem *item,IteratorFlags flags)

{
  long lVar1;
  QTreeWidgetItem *pQVar2;
  long lVar3;
  bool bVar4;
  QTreeWidgetItemIteratorPrivate *pQVar5;
  QTreeModel *pQVar6;
  long lVar7;
  long in_RCX;
  QTreeWidgetItem *itm;
  QTreeWidgetItem *pQVar8;
  long lVar9;
  QTreeWidgetItem *pQVar10;
  QTreeWidgetItem *this_00;
  long in_FS_OFFSET;
  QTreeWidgetItemIterator *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (QTreeWidgetItemIteratorPrivate *)operator_new(0x30);
  QAbstractItemView::model((QAbstractItemView *)item->view);
  pQVar6 = (QTreeModel *)QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
  pQVar5->m_currentIndex = 0;
  pQVar5->m_model = pQVar6;
  (pQVar5->m_parentIndex).super_QList<int>.d.d = (Data *)0x0;
  (pQVar5->m_parentIndex).super_QList<int>.d.ptr = (int *)0x0;
  (pQVar5->m_parentIndex).super_QList<int>.d.size = 0;
  pQVar5->q_ptr = this;
  (this->d_ptr).d = pQVar5;
  this->current = item;
  (this->flags).super_QFlagsStorageHelper<QTreeWidgetItemIterator::IteratorFlag,_4>.
  super_QFlagsStorage<QTreeWidgetItemIterator::IteratorFlag>.i =
       (Int)flags.super_QFlagsStorageHelper<QTreeWidgetItemIterator::IteratorFlag,_4>.
            super_QFlagsStorage<QTreeWidgetItemIterator::IteratorFlag>.i;
  QAbstractItemView::model((QAbstractItemView *)item->view);
  lVar7 = QMetaObject::cast((QObject *)&QTreeModel::staticMetaObject);
  local_40 = this;
  QtPrivate::QPodArrayOps<QTreeWidgetItemIterator*>::emplace<QTreeWidgetItemIterator*&>
            ((QPodArrayOps<QTreeWidgetItemIterator*> *)(lVar7 + 0x38),*(qsizetype *)(lVar7 + 0x48),
             &local_40);
  QList<QTreeWidgetItemIterator_*>::end((QList<QTreeWidgetItemIterator_*> *)(lVar7 + 0x38));
  pQVar8 = item->par;
  pQVar2 = pQVar5->m_model->rootItem;
  pQVar10 = pQVar8;
  if (pQVar8 == (QTreeWidgetItem *)0x0) {
    pQVar10 = pQVar2;
  }
  QTreeWidgetItem::executePendingSort(pQVar10);
  lVar7 = (pQVar10->children).d.size;
  if (lVar7 != 0) {
    lVar9 = -8;
    do {
      lVar1 = lVar7 * -8 + lVar9;
      if (lVar1 == -8) goto LAB_005c7900;
      in_RCX = lVar9 + 8;
      lVar3 = lVar9 + 8;
      lVar9 = in_RCX;
    } while (*(QTreeWidgetItem **)((long)(pQVar10->children).d.ptr + lVar3) != item);
    in_RCX = in_RCX >> 3;
LAB_005c7900:
    if (lVar1 != -8) goto LAB_005c790d;
  }
  in_RCX = -1;
LAB_005c790d:
  pQVar5->m_currentIndex = (int)in_RCX;
  if (pQVar8 != (QTreeWidgetItem *)0x0) {
    do {
      pQVar10 = pQVar8->par;
      this_00 = pQVar10;
      if (pQVar10 == (QTreeWidgetItem *)0x0) {
        this_00 = pQVar2;
      }
      QTreeWidgetItem::executePendingSort(this_00);
      lVar7 = (this_00->children).d.size;
      if (lVar7 == 0) {
LAB_005c7977:
        in_RCX = -1;
      }
      else {
        lVar9 = -8;
        do {
          lVar1 = lVar7 * -8 + lVar9;
          if (lVar1 == -8) goto LAB_005c7971;
          in_RCX = lVar9 + 8;
          lVar3 = lVar9 + 8;
          lVar9 = in_RCX;
        } while (*(QTreeWidgetItem **)((long)(this_00->children).d.ptr + lVar3) != pQVar8);
        in_RCX = in_RCX >> 3;
LAB_005c7971:
        if (lVar1 == -8) goto LAB_005c7977;
      }
      local_40 = (QTreeWidgetItemIterator *)CONCAT44(local_40._4_4_,(int)in_RCX);
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&pQVar5->m_parentIndex,0,(int *)&local_40);
      pQVar8 = pQVar10;
    } while (pQVar10 != (QTreeWidgetItem *)0x0);
  }
  if (this->current != (QTreeWidgetItem *)0x0) {
    bVar4 = matchesFlags(this,this->current);
    if (!bVar4) {
      operator++(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItemIterator::QTreeWidgetItemIterator(QTreeWidgetItem *item, IteratorFlags flags)
    : d_ptr(new QTreeWidgetItemIteratorPrivate(
                this, qobject_cast<QTreeModel*>(item->view->model()))),
      current(item), flags(flags)
{
    Q_D(QTreeWidgetItemIterator);
    Q_ASSERT(item);
    QTreeModel *model = qobject_cast<QTreeModel*>(item->view->model());
    Q_ASSERT(model);
    model->iterators.append(this);

    // Initialize m_currentIndex and m_parentIndex as it would be if we had traversed from
    // the beginning.
    QTreeWidgetItem *parent = item;
    parent = parent->parent();
    QTreeWidgetItem *root = d->m_model->rootItem;
    d->m_currentIndex = (parent ? parent : root)->indexOfChild(item);

    while (parent) {
        QTreeWidgetItem *itm = parent;
        parent = parent->parent();
        const int index = (parent ? parent : root)->indexOfChild(itm);
        d->m_parentIndex.prepend(index);
    }

    if (current && !matchesFlags(current))
        ++(*this);
}